

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpolants.cpp
# Opt level: O0

SubproofsUnionFind * __thiscall
Shell::Interpolants::computeSubproofs
          (Interpolants *this,Unit *refutation,SplittingFunction *splittingFunction)

{
  mapped_type *pmVar1;
  Unit *in_RSI;
  ProofIteratorBFSPreOrder *in_RDI;
  Unit *premise;
  VirtualIterator<Kernel::Unit_*> parents;
  Unit *current;
  ProofIteratorBFSPreOrder it;
  unordered_map<Kernel::Unit_*,_int,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>_>
  unitsToSize;
  unordered_map<Kernel::Unit_*,_Kernel::Unit_*,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_Kernel::Unit_*>_>_>
  *unitsToRepresentative;
  Unit *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  ProofIteratorBFSPreOrder *this_00;
  Unit *in_stack_fffffffffffffeb8;
  unordered_map<Kernel::Unit_*,_int,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>_>
  *in_stack_fffffffffffffec0;
  UnionFindMap *in_stack_fffffffffffffec8;
  Interpolants *in_stack_fffffffffffffed0;
  ProofIteratorBFSPreOrder *in_stack_fffffffffffffee8;
  
  this_00 = in_RDI;
  std::
  unordered_map<Kernel::Unit_*,_Kernel::Unit_*,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_Kernel::Unit_*>_>_>
  ::unordered_map((unordered_map<Kernel::Unit_*,_Kernel::Unit_*,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_Kernel::Unit_*>_>_>
                   *)0xbb1a7e);
  std::
  unordered_map<Kernel::Unit_*,_int,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>_>
  ::unordered_map((unordered_map<Kernel::Unit_*,_int,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>_>
                   *)0xbb1a8b);
  ProofIteratorBFSPreOrder::ProofIteratorBFSPreOrder
            (in_RDI,(Unit *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  while (in_stack_fffffffffffffe9f =
              ProofIteratorBFSPreOrder::hasNext
                        ((ProofIteratorBFSPreOrder *)
                         CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98)),
        (bool)in_stack_fffffffffffffe9f) {
    ProofIteratorBFSPreOrder::next(in_stack_fffffffffffffee8);
    pmVar1 = std::
             unordered_map<Kernel::Unit_*,_Kernel::Color,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_Kernel::Color>_>_>
             ::at((unordered_map<Kernel::Unit_*,_Kernel::Color,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_Kernel::Color>_>_>
                   *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                  (key_type *)in_stack_fffffffffffffe78);
    if (*pmVar1 == COLOR_LEFT) {
      Kernel::Unit::getParents((Unit *)this_00);
      while (in_stack_fffffffffffffe87 =
                  Lib::VirtualIterator<Kernel::Unit_*>::hasNext
                            ((VirtualIterator<Kernel::Unit_*> *)0xbb1b35),
            (bool)in_stack_fffffffffffffe87) {
        in_stack_fffffffffffffe78 =
             Lib::VirtualIterator<Kernel::Unit_*>::next((VirtualIterator<Kernel::Unit_*> *)0xbb1b55)
        ;
        std::
        unordered_map<Kernel::Unit_*,_int,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>_>
        ::unordered_map((unordered_map<Kernel::Unit_*,_int,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>_>
                         *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                        (unordered_map<Kernel::Unit_*,_int,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>_>
                         *)in_stack_fffffffffffffe78);
        merge(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
              in_stack_fffffffffffffeb8,in_RSI);
        std::
        unordered_map<Kernel::Unit_*,_int,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>_>
        ::~unordered_map((unordered_map<Kernel::Unit_*,_int,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>_>
                          *)0xbb1ba5);
      }
      Lib::VirtualIterator<Kernel::Unit_*>::~VirtualIterator
                ((VirtualIterator<Kernel::Unit_*> *)
                 CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    }
  }
  ProofIteratorBFSPreOrder::~ProofIteratorBFSPreOrder
            ((ProofIteratorBFSPreOrder *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  std::
  unordered_map<Kernel::Unit_*,_int,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>_>
  ::~unordered_map((unordered_map<Kernel::Unit_*,_int,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>_>
                    *)0xbb1c54);
  return (SubproofsUnionFind *)this_00;
}

Assistant:

Interpolants::SubproofsUnionFind Interpolants::computeSubproofs(Unit* refutation, const SplittingFunction& splittingFunction)
    {
        std::unordered_map<Unit*, Unit*> unitsToRepresentative; // maps each unit u1 (belonging to a red subproof) to the representative unit u2 of that subproof
        std::unordered_map<Unit*, int> unitsToSize; // needed for weighted quick-union: for each unit, counts number of elements rooted in that unit

        ProofIteratorBFSPreOrder it(refutation); // traverse the proof in breadth-first pre-order
        while (it.hasNext())
        {
            Unit* current = it.next();

            // standard union-find: if current inference is assigned to A-part of the proof,
            if (splittingFunction.at(current) == COLOR_LEFT)
            {
                // then for each parent inference,
                VirtualIterator<Unit*> parents = current->getParents();
                while (parents.hasNext())
                {
                    Unit* premise = parents.next();

                    // the parent may be from the B-part, this is to induce connectedness over a common parent
                    // (Even then we want to merge, so that this parent appears only once in the final interpolant.)
                    {
                        // merge the subproof of the current inference with the subproof of the parent inference
                        merge(unitsToRepresentative, unitsToSize, current, premise);
                    }
                }
            }
        }

        return unitsToRepresentative;
    }